

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall
bssl::SSLTranscript::GetFinishedMAC
          (SSLTranscript *this,uint8_t *out,size_t *out_len,SSL_SESSION *session,bool from_server)

{
  string_view label_00;
  Span<const_unsigned_char> seed1;
  Span<const_unsigned_char> seed2;
  bool bVar1;
  EVP_MD *digest_00;
  char *local_100;
  Span<const_unsigned_char> local_f0;
  Span<unsigned_char> local_e0;
  uchar *local_d0;
  size_t local_c8;
  size_t local_c0;
  char *local_b8;
  Span<const_unsigned_char> local_b0;
  Span<unsigned_char> local_a0;
  undefined1 local_90 [8];
  string_view label;
  size_t digest_len;
  uint8_t digest [64];
  bool from_server_local;
  SSL_SESSION *session_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SSLTranscript *this_local;
  
  digest[0x3f] = from_server;
  bVar1 = GetHash(this,(uint8_t *)&digest_len,(size_t *)&label._M_str);
  if (bVar1) {
    if ((digest[0x3f] & 1) == 0) {
      local_100 = "client finished";
    }
    else {
      local_100 = "server finished";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_90,local_100);
    digest_00 = Digest(this);
    Span<unsigned_char>::Span(&local_a0,out,0xc);
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
              ((Span<unsigned_char_const> *)&local_b0,&session->secret);
    local_c0 = (size_t)local_90;
    local_b8 = (char *)label._M_len;
    Span<unsigned_char>::Span(&local_e0,(uchar *)&digest_len,(size_t)label._M_str);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_d0,&local_e0);
    Span<const_unsigned_char>::Span(&local_f0);
    label_00._M_str = local_b8;
    label_00._M_len = local_c0;
    seed1.size_ = local_c8;
    seed1.data_ = local_d0;
    seed2.size_ = local_f0.size_;
    seed2.data_ = local_f0.data_;
    bVar1 = tls1_prf(digest_00,local_a0,local_b0,label_00,seed1,seed2);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      *out_len = 0xc;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SSLTranscript::GetFinishedMAC(uint8_t *out, size_t *out_len,
                                   const SSL_SESSION *session,
                                   bool from_server) const {
  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!GetHash(digest, &digest_len)) {
    return false;
  }

  std::string_view label = from_server ? "server finished" : "client finished";
  static const size_t kFinishedLen = 12;
  if (!tls1_prf(Digest(), Span(out, kFinishedLen), session->secret, label,
                Span(digest, digest_len), {})) {
    return false;
  }

  *out_len = kFinishedLen;
  return true;
}